

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remotecache.h
# Opt level: O0

int __thiscall
snmalloc::
RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::init
          (RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
           *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  iterator pvVar2;
  value_type *l;
  iterator __end2;
  iterator __begin2;
  Array<freelist::Builder<false>,_REMOTE_SLOTS> *__range2;
  Builder<false,_false,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_18;
  
  local_18 = std::
             array<snmalloc::freelist::Builder<false,_false,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_256UL>
             ::begin((array<snmalloc::freelist::Builder<false,_false,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_256UL>
                      *)0x1191c2);
  pvVar2 = std::
           array<snmalloc::freelist::Builder<false,_false,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_256UL>
           ::end((array<snmalloc::freelist::Builder<false,_false,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_256UL>
                  *)0x1191d1);
  for (; local_18 != pvVar2; local_18 = local_18 + 1) {
    ctx = (EVP_PKEY_CTX *)0x0;
    freelist::
    Builder<false,_false,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
    ::init(local_18,(EVP_PKEY_CTX *)0x0);
  }
  this->capacity = 0x4000;
  iVar1 = RemoteDeallocCacheBatching<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>,_16UL>
          ::init(&this->batching,ctx);
  return iVar1;
}

Assistant:

void init()
    {
#ifndef NDEBUG
      initialised = true;
#endif
      for (auto& l : list)
      {
        // We do not need to initialise with a particular slab, so pass
        // a null address.
        l.init(0, RemoteAllocator::key_global, NO_KEY_TWEAK);
      }
      capacity = REMOTE_CACHE;

      batching.init();
    }